

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MersenneTwister.h
# Opt level: O2

uint32 MTRand::hash(time_t t,clock_t c)

{
  long lVar1;
  ulong uVar2;
  size_t i;
  long lVar3;
  ulong uVar4;
  size_t j;
  time_t local_18;
  time_t t_local;
  clock_t c_local;
  
  local_18 = t;
  t_local = c;
  lVar1 = 0;
  for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
    lVar1 = (ulong)*(byte *)((long)&local_18 + lVar3) + lVar1 * 0x101;
  }
  uVar4 = 0;
  for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
    uVar4 = (ulong)*(byte *)((long)&t_local + lVar3) + uVar4 * 0x101;
  }
  uVar2 = lVar1 + hash::differ;
  hash::differ = hash::differ + 1;
  return uVar2 ^ uVar4;
}

Assistant:

inline MTRand::uint32 MTRand::hash( time_t t, clock_t c )
{
	// Get a uint32 from t and c
	// Better than uint32(x) in case x is floating point in [0,1]
	// Based on code by Lawrence Kirby (fred@genesis.demon.co.uk)

	static uint32 differ = 0;  // guarantee time-based seeds will change

	uint32 h1 = 0;
	unsigned char *p = (unsigned char *) &t;
	for( size_t i = 0; i < sizeof(t); ++i )
	{
		h1 *= UCHAR_MAX + 2U;
		h1 += p[i];
	}
	uint32 h2 = 0;
	p = (unsigned char *) &c;
	for( size_t j = 0; j < sizeof(c); ++j )
	{
		h2 *= UCHAR_MAX + 2U;
		h2 += p[j];
	}
	return ( h1 + differ++ ) ^ h2;
}